

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O3

void * __thiscall Centaurus::Stage1Runner::feed_callback(Stage1Runner *this)

{
  int *piVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  release_bank(this);
  pvVar2 = (this->super_BaseRunner).m_sub_window;
  uVar3 = (ulong)(uint)(this->super_BaseRunner).m_bank_num;
  do {
    do {
    } while ((int)uVar3 < 1);
    lVar4 = 0;
    do {
      piVar1 = (int *)((long)pvVar2 + lVar4 * 8 + 4);
      LOCK();
      bVar5 = *piVar1 == 0;
      if (bVar5) {
        *piVar1 = 1;
      }
      UNLOCK();
      if (bVar5) {
        this->m_current_bank = (int)lVar4;
        return (void *)(lVar4 * (this->super_BaseRunner).m_bank_size +
                       (long)(this->super_BaseRunner).m_main_window);
      }
      uVar3 = (ulong)(this->super_BaseRunner).m_bank_num;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)uVar3);
  } while( true );
}

Assistant:

virtual void *feed_callback() override
  {
    release_bank();
    return acquire_bank();
  }